

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Exec
          (SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *this,
          Matcher *matcher,Char *input,CharCount inputLength,CharCount *matchStart,
          CharCount *inputOffset,CharCount *nextSyncInputOffset,uint8 **instPointer,
          ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  bool bVar1;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *this_local;
  
  bVar1 = EquivScannerMixinT<4U>::Match
                    (&this->super_EquivScannerMixinT<4U>,matcher,input,inputLength,inputOffset);
  if (bVar1) {
    *matchStart = *inputOffset;
    *instPointer = *instPointer + 0x449;
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         Matcher::HardFail(matcher,input,inputLength,matchStart,inputOffset,instPointer,contStack,
                           assertionStack,qcTicks,ImmediateFail);
  }
  return this_local._7_1_;
}

Assistant:

inline bool SyncToLiteralAndContinueInstT<ScannerT>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (!this->Match(matcher, input, inputLength, inputOffset))
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        matchStart = inputOffset;
        instPointer += sizeof(*this);
        return false;
    }